

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O1

QString * __thiscall
ImportBaseFuncWrapper::getShortName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  _func_int **pp_Var1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  int iVar6;
  undefined4 extraout_var;
  char *__s;
  storage_type *psVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QString out;
  QString functionName;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QString local_48;
  QArrayData *local_28;
  char16_t *local_20;
  qsizetype qStack_18;
  undefined4 extraout_var_00;
  
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  iVar6 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(this);
  pp_Var1 = (this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer;
  if ((char)iVar6 == '\0') {
    iVar6 = (*pp_Var1[0x33])(this);
    __s = (char *)CONCAT44(extraout_var_00,iVar6);
    if (__s == (char *)0x0) {
      QVar9.m_data = (storage_type *)0x0;
      QVar9.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar9);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      (__return_storage_ptr__->d).d = (Data *)local_68;
      local_68 = (QArrayData *)0x0;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).ptr = pcStack_60;
      (__return_storage_ptr__->d).size = local_58;
      pcStack_60 = pcVar2;
    }
    else {
      psVar7 = (storage_type *)strlen(__s);
      QVar8.m_data = psVar7;
      QVar8.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar8);
      qVar3 = local_48.d.size;
      pcVar2 = local_48.d.ptr;
      pDVar5 = local_48.d.d;
      local_48.d.d = (Data *)local_68;
      local_68 = &pDVar5->super_QArrayData;
      local_48.d.ptr = pcStack_60;
      local_48.d.size = local_58;
      pcStack_60 = pcVar2;
      local_58 = qVar3;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
        }
      }
    }
    if (__s == (char *)0x0) goto LAB_0012f9e0;
  }
  else {
    iVar6 = (*pp_Var1[0x32])(this);
    local_68 = (QArrayData *)0x0;
    pcStack_60 = (char16_t *)0x0;
    local_58 = 0;
    QString::asprintf((char *)&local_28,"<ord: %llX>",CONCAT44(extraout_var,iVar6));
    qVar3 = local_58;
    pcVar2 = pcStack_60;
    pQVar4 = local_68;
    local_68 = local_28;
    local_28 = pQVar4;
    pcStack_60 = local_20;
    local_58 = qStack_18;
    local_20 = pcVar2;
    qStack_18 = qVar3;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,8);
      }
    }
    QString::operator=(&local_48,(QString *)&local_68);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,8);
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = local_48.d.d;
  local_48.d.d = (Data *)0x0;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).ptr = local_48.d.ptr;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_48.d.size;
  local_48.d.ptr = pcVar2;
  local_48.d.size = qVar3;
LAB_0012f9e0:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getShortName()
{
    QString functionName;
    if (isByOrdinal()) {
        uint64_t val = getOrdinal();
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#else
        out.sprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#endif
        functionName = out;
    } else {
        char *fName = this->getFunctionName();
        if (!fName) return "";
        functionName = fName;
    }
    return functionName;
}